

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderNonarrayInput.cpp
# Opt level: O2

void __thiscall
glcts::GeometryShaderNonarrayInputCase::deinit(GeometryShaderNonarrayInputCase *this)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  
  iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar2 + 0x1680))(0);
  (**(code **)(lVar2 + 0x78))(0x8d40,0);
  (**(code **)(lVar2 + 0xd8))(0);
  if (this->m_po_a_valid != 0) {
    (**(code **)(lVar2 + 0x448))();
  }
  if (this->m_po_b_valid != 0) {
    (**(code **)(lVar2 + 0x448))();
  }
  if (this->m_fs != 0) {
    (**(code **)(lVar2 + 0x470))();
  }
  if (this->m_gs_invalid_ib != 0) {
    (**(code **)(lVar2 + 0x470))();
  }
  if (this->m_gs_invalid_non_ib != 0) {
    (**(code **)(lVar2 + 0x470))();
  }
  if (this->m_gs_valid_ib != 0) {
    (**(code **)(lVar2 + 0x470))();
  }
  if (this->m_gs_valid_non_ib != 0) {
    (**(code **)(lVar2 + 0x470))();
  }
  if (this->m_vs_valid_ib != 0) {
    (**(code **)(lVar2 + 0x470))();
  }
  if (this->m_vs_valid_non_ib != 0) {
    (**(code **)(lVar2 + 0x470))();
  }
  if (this->m_to_id != 0) {
    (**(code **)(lVar2 + 0x480))(1,&this->m_to_id);
  }
  if (this->m_fbo_id != 0) {
    (**(code **)(lVar2 + 0x440))(1,&this->m_fbo_id);
  }
  if (this->m_vao_id != 0) {
    (**(code **)(lVar2 + 0x490))(1,&this->m_vao_id);
  }
  TestCaseBase::deinit(&this->super_TestCaseBase);
  return;
}

Assistant:

void GeometryShaderNonarrayInputCase::deinit(void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Reset OpenGL ES state */
	gl.useProgram(0);
	gl.bindFramebuffer(GL_FRAMEBUFFER, 0);
	gl.bindVertexArray(0);

	if (m_po_a_valid != 0)
	{
		gl.deleteProgram(m_po_a_valid);
	}

	if (m_po_b_valid != 0)
	{
		gl.deleteProgram(m_po_b_valid);
	}

	if (m_fs != 0)
	{
		gl.deleteShader(m_fs);
	}

	if (m_gs_invalid_ib != 0)
	{
		gl.deleteShader(m_gs_invalid_ib);
	}

	if (m_gs_invalid_non_ib != 0)
	{
		gl.deleteShader(m_gs_invalid_non_ib);
	}

	if (m_gs_valid_ib != 0)
	{
		gl.deleteShader(m_gs_valid_ib);
	}

	if (m_gs_valid_non_ib != 0)
	{
		gl.deleteShader(m_gs_valid_non_ib);
	}

	if (m_vs_valid_ib != 0)
	{
		gl.deleteShader(m_vs_valid_ib);
	}

	if (m_vs_valid_non_ib != 0)
	{
		gl.deleteShader(m_vs_valid_non_ib);
	}

	if (m_to_id != 0)
	{
		gl.deleteTextures(1, &m_to_id);
	}

	if (m_fbo_id != 0)
	{
		gl.deleteFramebuffers(1, &m_fbo_id);
	}

	if (m_vao_id != 0)
	{
		gl.deleteVertexArrays(1, &m_vao_id);
	}

	/* Release base class */
	TestCaseBase::deinit();
}